

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

int Saig_StrSimIsEqual(Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(int *)((long)(pObj0->field_5).pData + lVar1 * 4) !=
        *(int *)((long)(pObj1->field_5).pData + lVar1 * 4)) {
      return 0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  return 1;
}

Assistant:

int Saig_StrSimIsEqual( Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    unsigned * pSims0 = (unsigned *)pObj0->pData;
    unsigned * pSims1 = (unsigned *)pObj1->pData;
    int i;
    for ( i = 0; i < SAIG_WORDS; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}